

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::Extension::IsInitialized
          (Extension *this,ExtensionSet *ext_set,MessageLite *extendee,int number,Arena *arena)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar5;
  LogMessage *this_00;
  Nonnull<const_char_*> failure_msg;
  int iVar6;
  Arena *unaff_R12;
  undefined8 unaff_R13;
  Extension *unaff_R14;
  MessageLite *unaff_R15;
  string_view str;
  string_view sVar7;
  bool was_packed_on_wire;
  ExtensionInfo extension_info;
  GeneratedExtensionFinder finder;
  bool local_69;
  undefined1 local_68 [16];
  anon_union_16_2_0e0aa8cc_for_ExtensionInfo_6 local_58;
  FieldDescriptor *local_48;
  LazyEagerVerifyFnType p_Stack_40;
  GeneratedExtensionFinder local_38;
  
  if ((byte)(this->type - 0x13) < 0xee) {
    IsInitialized();
  }
  else {
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) != 10) {
      return true;
    }
    if (this->is_repeated == true) {
      iVar6 = ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value)->current_size_;
      if (iVar6 < 1) {
        return iVar6 < 1;
      }
      pVVar5 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value,0);
      bVar2 = MessageLite::IsInitialized(pVVar5);
      if (!bVar2) {
        return iVar6 < 1;
      }
      iVar6 = 1;
      do {
        iVar1 = ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value)->current_size_;
        bVar2 = iVar1 <= iVar6;
        if (iVar1 <= iVar6) {
          return bVar2;
        }
        pVVar5 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value,iVar6);
        bVar3 = MessageLite::IsInitialized(pVVar5);
        iVar6 = iVar6 + 1;
      } while (bVar3);
      return bVar2;
    }
    if ((this->field_0xa & 2) != 0) {
      return true;
    }
    if ((this->field_0xa & 4) == 0) {
      bVar2 = MessageLite::IsInitialized(this->field_0);
      return bVar2;
    }
    local_69 = false;
    local_48 = (FieldDescriptor *)0x0;
    p_Stack_40 = (LazyEagerVerifyFnType)0x0;
    local_58.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_58.enum_validity_check.arg = (void *)0x0;
    local_68._0_8_ = (MessageLite *)0x0;
    local_68._8_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    local_38.extendee_ = extendee;
    bVar2 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                      (ext_set,2,number,&local_38,(ExtensionInfo *)local_68,&local_69);
    failure_msg = (Nonnull<const_char_*>)0x0;
    unaff_R13 = (EnumValidityFuncWithArg *)0x0;
    if (bVar2) {
      unaff_R13 = local_58.enum_validity_check.func;
    }
    unaff_R12 = arena;
    unaff_R14 = this;
    unaff_R15 = extendee;
    if ((EnumValidityFuncWithArg *)unaff_R13 != (EnumValidityFuncWithArg *)0x0) goto LAB_00408b74;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          ((void *)0x0,(void *)0x0,"prototype != nullptr");
LAB_00408b74:
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    uVar4 = (**(code **)(**(long **)&(unaff_R14->field_0).int32_t_value + 0x50))
                      (*(long **)&(unaff_R14->field_0).int32_t_value,unaff_R13,unaff_R12);
    return (bool)uVar4;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x69d,failure_msg);
  sVar7._M_str = "extendee: ";
  sVar7._M_len = 10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)local_68,sVar7);
  sVar7 = MessageLite::GetTypeName(unaff_R15);
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_68,sVar7);
  str._M_str = "; number: ";
  str._M_len = 10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,number);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_68);
}

Assistant:

bool ExtensionSet::Extension::IsInitialized(const ExtensionSet* ext_set,
                                            const MessageLite* extendee,
                                            int number, Arena* arena) const {
  if (cpp_type(type) != WireFormatLite::CPPTYPE_MESSAGE) return true;

  if (is_repeated) {
    for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
      if (!ptr.repeated_message_value->Get(i).IsInitialized()) {
        return false;
      }
    }
    return true;
  }

  if (is_cleared) return true;

  if (!is_lazy) return ptr.message_value->IsInitialized();

  const MessageLite* prototype =
      ext_set->GetPrototypeForLazyMessage(extendee, number);
  ABSL_DCHECK_NE(prototype, nullptr)
      << "extendee: " << extendee->GetTypeName() << "; number: " << number;
  return ptr.lazymessage_value->IsInitialized(prototype, arena);
}